

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Attribute_Access<const_chaiscript::AST_Node_Type,_chaiscript::AST_Node>::
~Attribute_Access(Attribute_Access<const_chaiscript::AST_Node_Type,_chaiscript::AST_Node> *this)

{
  Attribute_Access<const_chaiscript::AST_Node_Type,_chaiscript::AST_Node> *this_local;
  
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            (&this->m_param_types);
  Proxy_Function_Base::~Proxy_Function_Base(&this->super_Proxy_Function_Base);
  return;
}

Assistant:

explicit Attribute_Access(T Class::*t_attr)
          : Proxy_Function_Base(param_types(), 1)
          , m_attr(t_attr) {
      }